

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb.c
# Opt level: O3

void gameboy_update(void *chip,UINT32 samples,DEV_SMPL **outputs)

{
  SOUND *snd;
  SOUND *snd_00;
  SOUND *snd_01;
  byte bVar1;
  uint uVar2;
  byte bVar3;
  char cVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  char cVar8;
  int iVar9;
  char cVar10;
  int iVar11;
  UINT32 cycles;
  UINT32 cycles_00;
  ulong uVar12;
  
  if (samples == 0) {
    bVar3 = *(byte *)((long)chip + 0x11);
    cVar4 = *(char *)((long)chip + 0x45);
    cVar8 = *(char *)((long)chip + 0x79);
    cVar10 = *(char *)((long)chip + 0xad);
  }
  else {
    snd = (SOUND *)((long)chip + 0xc);
    snd_00 = (SOUND *)((long)chip + 0x40);
    snd_01 = (SOUND *)((long)chip + 0xa8);
    uVar12 = *(ulong *)((long)chip + 0x128);
    uVar6 = 0;
    do {
      uVar12 = uVar12 + *(long *)((long)chip + 0x120);
      *(ulong *)((long)chip + 0x128) = uVar12;
      if (*(char *)((long)chip + 0xdc) != '\0') {
        cycles_00 = (UINT32)(uVar12 >> 0x20);
        uVar2 = *(uint *)((long)chip + 0xe8);
        *(uint *)((long)chip + 0xe8) = uVar2 + cycles_00;
        if (0x1fff < (uVar2 + cycles_00 ^ uVar2)) {
          cycles = 0x2000 - (uVar2 & 0x1fff);
          gb_update_square_channel(snd,cycles);
          gb_update_square_channel(snd_00,cycles);
          gb_update_wave_channel((gb_sound_t *)chip,(SOUND *)((long)chip + 0x74),cycles);
          gb_update_noise_channel((gb_sound_t *)(ulong)*(byte *)((long)chip + 0xab),snd_01,cycles);
          cycles_00 = cycles_00 - cycles;
          switch(*(uint *)((long)chip + 0xe8) >> 0xd & 7) {
          case 0:
            if ((*(char *)((long)chip + 0x16) == '\x01') &&
               (bVar3 = *(char *)((long)chip + 0x13) + 1U & *(byte *)((long)chip + 0x14),
               *(byte *)((long)chip + 0x13) = bVar3, bVar3 == 0)) {
              *(undefined1 *)((long)chip + 0x11) = 0;
              *(undefined1 *)((long)chip + 0x15) = 0;
            }
            cVar4 = *(char *)((long)chip + 0x4a);
            break;
          case 2:
          case 6:
            gb_tick_sweep(snd);
          case 4:
            if ((*(char *)((long)chip + 0x16) == '\x01') &&
               (bVar3 = *(char *)((long)chip + 0x13) + 1U & *(byte *)((long)chip + 0x14),
               *(byte *)((long)chip + 0x13) = bVar3, bVar3 == 0)) {
              *(undefined1 *)((long)chip + 0x11) = 0;
              *(undefined1 *)((long)chip + 0x15) = 0;
            }
            cVar4 = *(char *)((long)chip + 0x4a);
            break;
          case 7:
            gb_tick_envelope(snd);
            gb_tick_envelope(snd_00);
            gb_tick_envelope(snd_01);
          default:
            goto LAB_0015faed;
          }
          if ((cVar4 == '\x01') &&
             (bVar3 = *(char *)((long)chip + 0x47) + 1U & *(byte *)((long)chip + 0x48),
             *(byte *)((long)chip + 0x47) = bVar3, bVar3 == 0)) {
            *(undefined1 *)((long)chip + 0x45) = 0;
            *(undefined1 *)((long)chip + 0x49) = 0;
          }
          if ((*(char *)((long)chip + 0x7e) == '\x01') &&
             (bVar3 = *(char *)((long)chip + 0x7b) + 1U & *(byte *)((long)chip + 0x7c),
             *(byte *)((long)chip + 0x7b) = bVar3, bVar3 == 0)) {
            *(undefined1 *)((long)chip + 0x79) = 0;
            *(undefined1 *)((long)chip + 0x7d) = 0;
          }
          if ((*(char *)((long)chip + 0xb2) == '\x01') &&
             (bVar3 = *(char *)((long)chip + 0xaf) + 1U & *(byte *)((long)chip + 0xb0),
             *(byte *)((long)chip + 0xaf) = bVar3, bVar3 == 0)) {
            *(undefined1 *)((long)chip + 0xad) = 0;
            *(undefined1 *)((long)chip + 0xb1) = 0;
          }
        }
LAB_0015faed:
        gb_update_square_channel(snd,cycles_00);
        gb_update_square_channel(snd_00,cycles_00);
        gb_update_wave_channel((gb_sound_t *)chip,(SOUND *)((long)chip + 0x74),cycles_00);
        gb_update_noise_channel((gb_sound_t *)(ulong)*(byte *)((long)chip + 0xab),snd_01,cycles_00);
        uVar12 = (ulong)*(uint *)((long)chip + 0x128);
      }
      uVar12 = uVar12 & 0xffffffff;
      *(ulong *)((long)chip + 0x128) = uVar12;
      bVar3 = *(byte *)((long)chip + 0x11);
      iVar5 = 0;
      if (bVar3 == 1) {
        iVar7 = 0;
        if (*(char *)((long)chip + 0x3e) == '\0') {
          iVar7 = (int)*(char *)((long)chip + 0x1e) * (int)*(char *)((long)chip + 0x22);
          iVar5 = iVar7;
          if (*(char *)((long)chip + 0xdf) == '\0') {
            iVar5 = 0;
          }
          if (*(char *)((long)chip + 0xe0) == '\0') {
            iVar7 = 0;
          }
        }
      }
      else {
        iVar7 = 0;
      }
      cVar4 = *(char *)((long)chip + 0x45);
      if ((cVar4 == '\x01') && (*(char *)((long)chip + 0x72) == '\0')) {
        iVar11 = (int)*(char *)((long)chip + 0x52) * (int)*(char *)((long)chip + 0x56);
        iVar9 = iVar11;
        if (*(char *)((long)chip + 0xe1) == '\0') {
          iVar9 = 0;
        }
        iVar5 = iVar5 + iVar9;
        if (*(char *)((long)chip + 0xe2) == '\0') {
          iVar11 = 0;
        }
        iVar7 = iVar7 + iVar11;
      }
      cVar8 = *(char *)((long)chip + 0x79);
      if ((cVar8 == '\x01') && (*(char *)((long)chip + 0xa6) == '\0')) {
        iVar11 = (int)*(char *)((long)chip + 0x8a);
        iVar9 = iVar11;
        if (*(char *)((long)chip + 0xe3) == '\0') {
          iVar9 = 0;
        }
        iVar5 = iVar5 + iVar9;
        if (*(char *)((long)chip + 0xe4) == '\0') {
          iVar11 = 0;
        }
        iVar7 = iVar7 + iVar11;
      }
      cVar10 = *(char *)((long)chip + 0xad);
      if ((cVar10 == '\x01') && (*(char *)((long)chip + 0xda) == '\0')) {
        iVar11 = (int)*(char *)((long)chip + 0xba) * (int)*(char *)((long)chip + 0xbe);
        iVar9 = iVar11;
        if (*(char *)((long)chip + 0xe5) == '\0') {
          iVar9 = 0;
        }
        iVar5 = iVar5 + iVar9;
        if (*(char *)((long)chip + 0xe6) == '\0') {
          iVar11 = 0;
        }
        iVar7 = iVar7 + iVar11;
      }
      bVar1 = *(byte *)((long)chip + 0xde);
      (*outputs)[uVar6] = (uint)*(byte *)((long)chip + 0xdd) * iVar5 * 0x40;
      outputs[1][uVar6] = (uint)bVar1 * iVar7 * 0x40;
      uVar6 = uVar6 + 1;
    } while (samples != uVar6);
  }
  *(byte *)((long)chip + 0x106) =
       cVar10 << 3 | cVar8 << 2 | cVar4 * '\x02' | *(byte *)((long)chip + 0x106) & 0xf0 | bVar3;
  return;
}

Assistant:

static void gameboy_update(void *chip, UINT32 samples, DEV_SMPL **outputs)
{
	gb_sound_t *gb = (gb_sound_t *)chip;
	DEV_SMPL sample, left, right;
	UINT32 i;

	for (i = 0; i < samples; i++)
	{
		left = right = 0;

		RC_STEP(&gb->cycleCntr);
		gb_update_state(gb, RC_GET_VAL(&gb->cycleCntr));
		RC_MASK(&gb->cycleCntr);

		/* Mode 1 - Wave with Envelope and Sweep */
		if (gb->snd_1.on && !gb->snd_1.Muted)
		{
			sample = gb->snd_1.signal * gb->snd_1.envelope_value;

			if (gb->snd_control.mode1_left)
				left += sample;
			if (gb->snd_control.mode1_right)
				right += sample;
		}

		/* Mode 2 - Wave with Envelope */
		if (gb->snd_2.on && !gb->snd_2.Muted)
		{
			sample = gb->snd_2.signal * gb->snd_2.envelope_value;
			if (gb->snd_control.mode2_left)
				left += sample;
			if (gb->snd_control.mode2_right)
				right += sample;
		}

		/* Mode 3 - Wave patterns from WaveRAM */
		if (gb->snd_3.on && !gb->snd_3.Muted)
		{
			sample = gb->snd_3.signal;
			if (gb->snd_control.mode3_left)
				left += sample;
			if (gb->snd_control.mode3_right)
				right += sample;
		}

		/* Mode 4 - Noise with Envelope */
		if (gb->snd_4.on && !gb->snd_4.Muted)
		{
			sample = gb->snd_4.signal * gb->snd_4.envelope_value;
			if (gb->snd_control.mode4_left)
				left += sample;
			if (gb->snd_control.mode4_right)
				right += sample;
		}

		/* Adjust for master volume */
		left *= gb->snd_control.vol_left;
		right *= gb->snd_control.vol_right;

		/* pump up the volume */
		left <<= 6;
		right <<= 6;

		/* Update the buffers */
		outputs[0][i] = left;
		outputs[1][i] = right;
	}

	gb->snd_regs[NR52] = (gb->snd_regs[NR52]&0xf0) | gb->snd_1.on | (gb->snd_2.on << 1) | (gb->snd_3.on << 2) | (gb->snd_4.on << 3);
}